

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeCharacter(ExpressionContext *ctx,SynCharacter *syntax)

{
  char *pcVar1;
  TypeBase *pTVar2;
  uchar uVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  
  pcVar1 = (syntax->value).begin;
  uVar3 = pcVar1[1];
  if (uVar3 == '\\') {
    uVar3 = anon_unknown.dwarf_9fd58::ParseEscapeSequence(ctx,&syntax->super_SynBase,pcVar1 + 1);
  }
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
  pTVar2 = ctx->typeChar;
  pEVar5->typeID = 4;
  pEVar5->source = &syntax->super_SynBase;
  pEVar5->type = pTVar2;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002294d8;
  pEVar5->field_0x29 = uVar3;
  return pEVar5;
}

Assistant:

ExprBase* AnalyzeCharacter(ExpressionContext &ctx, SynCharacter *syntax)
{
	unsigned char result = (unsigned char)syntax->value.begin[1];

	if(result == '\\')
		result = ParseEscapeSequence(ctx, syntax, syntax->value.begin + 1);

	return new (ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(syntax, ctx.typeChar, result);
}